

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

void __thiscall
perfetto::protos::pbzero::TracePacket::set_trusted_pid(TracePacket *this,int32_t value)

{
  int32_t value_local;
  TracePacket *this_local;
  
  protozero::internal::FieldWriter<(protozero::proto_utils::ProtoSchemaType)5>::Append
            (&this->super_Message,0x4f,value);
  return;
}

Assistant:

void set_trusted_pid(int32_t value) {
    static constexpr uint32_t field_id = FieldMetadata_TrustedPid::kFieldId;
    // Call the appropriate protozero::Message::Append(field_id, ...)
    // method based on the type of the field.
    ::protozero::internal::FieldWriter<
      ::protozero::proto_utils::ProtoSchemaType::kInt32>
        ::Append(*this, field_id, value);
  }